

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O0

void __thiscall
duckdb::DependencyManager::ReorderEntries
          (DependencyManager *this,catalog_entry_vector_t *entries,CatalogTransaction transaction)

{
  bool bVar1;
  undefined8 in_RSI;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  *in_stack_00000008;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *in_stack_00000010;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  iterator __end1;
  iterator __begin1;
  catalog_entry_vector_t *__range1;
  catalog_entry_set_t visited;
  catalog_entry_vector_t reordered;
  undefined1 in_stack_00000130 [40];
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  *in_stack_ffffffffffffff08;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *in_stack_ffffffffffffff10;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  local_70;
  undefined8 local_68;
  undefined8 local_10;
  
  local_10 = in_RSI;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::vector
            ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)0x2b1a6e);
  ::std::
  unordered_set<std::reference_wrapper<duckdb::CatalogEntry>,_duckdb::CatalogEntryHashFunction,_duckdb::CatalogEntryEquality,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::unordered_set((unordered_set<std::reference_wrapper<duckdb::CatalogEntry>,_duckdb::CatalogEntryHashFunction,_duckdb::CatalogEntryEquality,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   *)0x2b1a7b);
  local_68 = local_10;
  local_70._M_current =
       (reference_wrapper<duckdb::CatalogEntry> *)
       ::std::
       vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
       ::begin(in_stack_ffffffffffffff08);
  ::std::
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::end(in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
    ::operator*(&local_70);
    in_stack_ffffffffffffff10 = in_stack_00000010;
    ::std::reference_wrapper::operator_cast_to_CatalogEntry_
              ((reference_wrapper<duckdb::CatalogEntry> *)0x2b1b11);
    in_stack_ffffffffffffff08 = in_stack_00000008;
    ReorderEntry((DependencyManager *)transaction.start_time,(CatalogTransaction)in_stack_00000130,
                 (CatalogEntry *)transaction.transaction_id,
                 (catalog_entry_set_t *)transaction.transaction.ptr,
                 (catalog_entry_vector_t *)transaction.context.ptr);
    __gnu_cxx::
    __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
    ::operator++(&local_70);
  }
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::clear
            ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)0x2b1b98);
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator=
            (in_stack_ffffffffffffff10,
             (vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)in_stack_ffffffffffffff08
            );
  ::std::
  unordered_set<std::reference_wrapper<duckdb::CatalogEntry>,_duckdb::CatalogEntryHashFunction,_duckdb::CatalogEntryEquality,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::~unordered_set((unordered_set<std::reference_wrapper<duckdb::CatalogEntry>,_duckdb::CatalogEntryHashFunction,_duckdb::CatalogEntryEquality,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    *)0x2b1bbc);
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)0x2b1bc9);
  return;
}

Assistant:

void DependencyManager::ReorderEntries(catalog_entry_vector_t &entries, CatalogTransaction transaction) {
	catalog_entry_vector_t reordered;
	catalog_entry_set_t visited;
	for (auto &entry : entries) {
		ReorderEntry(transaction, entry, visited, reordered);
	}
	// If this would fail, that means there are more entries that we somehow reached through the dependency manager
	// but those entries should not actually be visible to this transaction
	D_ASSERT(entries.size() == reordered.size());
	entries.clear();
	entries = reordered;
}